

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  cmListFileParser parser;
  allocator local_b9;
  cmListFileParser local_b8;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_b8,filename,&local_b9);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (!bVar1) {
      cmListFileParser::cmListFileParser(&local_b8,this,lfbt,messenger,filename);
      bVar1 = cmListFileParser::ParseFile(&local_b8);
      cmListFileParser::~cmListFileParser(&local_b8);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}